

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema * __thiscall
capnp::SchemaLoader::Impl::loadEmpty
          (Impl *this,uint64_t id,StringPtr name,Which kind,bool isPlaceholder)

{
  RawSchema *pRVar1;
  Reader local_330;
  Fault local_300;
  Fault f;
  Builder local_2d0;
  Builder local_2a8;
  ArrayPtr<const_char> local_280 [2];
  undefined1 local_260 [8];
  Builder node;
  undefined1 local_228 [8];
  MallocMessageBuilder builder;
  word scratch [32];
  bool isPlaceholder_local;
  Which kind_local;
  uint64_t id_local;
  Impl *this_local;
  StringPtr name_local;
  
  name_local.content.ptr = (char *)name.content.size_;
  this_local = (Impl *)name.content.ptr;
  builder.moreSegments.builder.disposer = (ArrayDisposer *)0x0;
  kj::ArrayPtr<capnp::word>::ArrayPtr<32ul>
            ((ArrayPtr<capnp::word> *)&node._builder.dataSize,
             (word (*) [32])&builder.moreSegments.builder.disposer);
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_228,stack0xfffffffffffffdc8,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::schema::Node>((Builder *)local_260,(MessageBuilder *)local_228);
  capnp::schema::Node::Builder::setId((Builder *)local_260,id);
  Text::Reader::Reader((Reader *)local_280,(StringPtr *)&this_local);
  capnp::schema::Node::Builder::setDisplayName((Builder *)local_260,(Reader)local_280[0]);
  switch(kind) {
  case FILE:
  case CONST:
  case ANNOTATION:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[12]>
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x595,FAILED,(char *)0x0,"\"Not a type.\"",(char (*) [12])"Not a type.");
    kj::_::Debug::Fault::fatal(&local_300);
  case STRUCT:
    capnp::schema::Node::Builder::initStruct(&local_2a8,(Builder *)local_260);
    break;
  case ENUM:
    capnp::schema::Node::Builder::initEnum(&local_2d0,(Builder *)local_260);
    break;
  case INTERFACE:
    capnp::schema::Node::Builder::initInterface((Builder *)&f,(Builder *)local_260);
  }
  capnp::schema::Node::Builder::operator_cast_to_Reader(&local_330,(Builder *)local_260);
  pRVar1 = load(this,&local_330,isPlaceholder);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_228);
  return pRVar1;
}

Assistant:

_::RawSchema* SchemaLoader::Impl::loadEmpty(
    uint64_t id, kj::StringPtr name, schema::Node::Which kind, bool isPlaceholder) {
  word scratch[32];
  memset(scratch, 0, sizeof(scratch));
  MallocMessageBuilder builder(scratch);
  auto node = builder.initRoot<schema::Node>();
  node.setId(id);
  node.setDisplayName(name);
  switch (kind) {
    case schema::Node::STRUCT: node.initStruct(); break;
    case schema::Node::ENUM: node.initEnum(); break;
    case schema::Node::INTERFACE: node.initInterface(); break;

    case schema::Node::FILE:
    case schema::Node::CONST:
    case schema::Node::ANNOTATION:
      KJ_FAIL_REQUIRE("Not a type.");
      break;
  }

  return load(node, isPlaceholder);
}